

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbuffer.c
# Opt level: O2

entry_t * bounded_buffer_get(bounded_buffer_t *bb)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  entry_t *peVar2;
  int iVar3;
  
  __mutex = &bb->lock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  while (iVar1 = bb->head, bb->tail == iVar1) {
    pthread_cond_wait((pthread_cond_t *)&bb->has_items,(pthread_mutex_t *)__mutex);
  }
  iVar3 = iVar1 % bb->size;
  peVar2 = bb->entries[iVar3];
  bb->head = iVar1 + 1;
  bb->entries[iVar3] = (entry_t *)0x0;
  pthread_cond_signal((pthread_cond_t *)&bb->has_space);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return peVar2;
}

Assistant:

entry_t* bounded_buffer_get(bounded_buffer_t* bb)
{
    pthread_mutex_lock(&bb->lock);

    while (bb->tail == bb->head)
    {
        pthread_cond_wait(&bb->has_items, &bb->lock);
    }

    entry_t* entry = bb->entries[bb->head % bb->size];
    bb->entries[bb->head++ % bb->size] = NULL;
    pthread_cond_signal(&bb->has_space);

    pthread_mutex_unlock(&bb->lock);
    return entry;
}